

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneExtensionRange
          (MessageGenerator *this,Printer *p,int start,int end)

{
  long *plVar1;
  long lVar2;
  long alStack_258 [4];
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
  vStack_238;
  long alStack_210 [2];
  anon_class_1_0_00000001 local_1f9;
  int local_1f8;
  int local_1f4;
  undefined1 local_1f0 [16];
  string local_1e0;
  string local_1c0;
  Sub local_1a0;
  Sub local_e8;
  
  alStack_210[0] = 0xdbbce3;
  local_1f8 = end;
  local_1f4 = start;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
              *)local_1f0,p,&this->variables_);
  alStack_210[0] = 0xdbbd04;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"start","");
  alStack_210[0] = 0xdbbd1b;
  io::Printer::Sub::Sub<int&>(&local_1a0,&local_1c0,&local_1f4);
  alStack_210[0] = 0xdbbd45;
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e0,"end","");
  alStack_210[0] = 0xdbbd57;
  io::Printer::Sub::Sub<int&>(&local_e8,&local_1e0,&local_1f8);
  alStack_210[0] = 0xdbbd75;
  io::Printer::Emit(p,&local_1a0,2,0xad,
                    "\n        // Extension range [$start$, $end$)\n        target = this_.$extensions$._InternalSerialize(\n            &default_instance(), $start$, $end$, target, stream);\n      "
                   );
  lVar2 = 0x170;
  do {
    if (local_1c0.field_2._M_local_buf[lVar2 + 8] == '\x01') {
      alStack_210[0] = 0xdbbd9c;
      std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                 (local_1f0 + lVar2 + 8));
    }
    if ((long *)(&stack0xfffffffffffffe00 + lVar2) != *(long **)((long)alStack_210 + lVar2)) {
      alStack_210[0] = 0xdbbdb8;
      operator_delete(*(long **)((long)alStack_210 + lVar2),
                      *(long *)(&stack0xfffffffffffffe00 + lVar2) + 1);
    }
    alStack_210[0] = 0xdbbdcc;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
      ::_S_vtable._M_arr[*(byte *)((long)alStack_210 + lVar2 + -8)]._M_data)
              (&local_1f9,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                *)((long)&vStack_238.
                          super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                          .
                          super__Move_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_assign_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Move_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                          .
                          super__Variant_storage_alias<std::__cxx11::basic_string<char>,_std::function<bool_()>_>
                  + lVar2));
    plVar1 = (long *)((long)alStack_258 + lVar2 + 0x10);
    *(undefined1 *)((long)alStack_210 + lVar2 + -8) = 0xff;
    if (plVar1 != *(long **)((long)alStack_258 + lVar2)) {
      alStack_210[0] = 0xdbbdec;
      operator_delete(*(long **)((long)alStack_258 + lVar2),*plVar1 + 1);
    }
    lVar2 = lVar2 + -0xb8;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    alStack_210[0] = 0xdbbe0c;
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    alStack_210[0] = 0xdbbe23;
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_1f0[0] == true) {
    alStack_210[0] = 0xdbbe39;
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::pop_back((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                *)(local_1f0._8_8_ + 0x98));
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneExtensionRange(io::Printer* p,
                                                          int start, int end) {
  auto v = p->WithVars(variables_);
  p->Emit(  //
      {{"start", start}, {"end", end}},
      R"cc(
        // Extension range [$start$, $end$)
        target = this_.$extensions$._InternalSerialize(
            &default_instance(), $start$, $end$, target, stream);
      )cc");
}